

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

void __thiscall QTimer::setInterval(QTimer *this,milliseconds interval)

{
  nanoseconds interval_00;
  bool bVar1;
  int iVar2;
  parameter_type pVar3;
  TimerId TVar4;
  QTimerPrivate *this_00;
  rep rVar5;
  duration<long,_std::ratio<1L,_1000L>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  milliseconds unaff_retaddr;
  QObject *in_stack_00000008;
  TimerId newId;
  bool intervalChanged;
  QTimerPrivate *d;
  int msec;
  undefined4 in_stack_00000068;
  TimerId in_stack_0000006c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  TimerType in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int v;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTimer *)0x42bb9e);
  local_10.__r = (rep)checkInterval((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                     in_stack_ffffffffffffffa0),unaff_retaddr);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_10);
  iVar2 = (int)rVar5;
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
              *)this_00);
  v = iVar2;
  pVar3 = QPropertyData<int>::valueBypassingBindings(&(this_00->inter).super_QPropertyData<int>);
  bVar6 = iVar2 != pVar3;
  QPropertyData<int>::setValueBypassingBindings(&(this_00->inter).super_QPropertyData<int>,v);
  bVar1 = QTimerPrivate::isActive(this_00);
  if (bVar1) {
    QObject::killTimer(in_stack_00000008,in_stack_0000006c);
    ms<(char)49>();
    std::chrono::operator*((int *)in_RDI,(duration<long,_std::ratio<1L,_1000L>_> *)0x42bc5f);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffa0),in_RDI);
    QObjectBindableProperty::operator_cast_to_TimerType
              ((QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
                *)0x42bc84);
    interval_00.__r._4_4_ = in_stack_0000006c;
    interval_00.__r._0_4_ = in_stack_00000068;
    TVar4 = QObject::startTimer((QObject *)CONCAT44(v,in_stack_ffffffffffffffd8),interval_00,
                                in_stack_ffffffffffffffd4);
    if ((int)TVar4 < 1) {
      this_00->id = Invalid;
      QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
      ::notify((QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
                *)this_00);
    }
    else {
      this_00->id = TVar4;
    }
  }
  if (bVar6) {
    QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
    ::notify(_newId);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTimer::setInterval(std::chrono::milliseconds interval)
{
    Q_D(QTimer);

    interval = checkInterval("QTimer::setInterval", interval);
    const int msec = interval.count();
    d->inter.removeBindingUnlessInWrapper();
    const bool intervalChanged = msec != d->inter.valueBypassingBindings();
    d->inter.setValueBypassingBindings(msec);
    if (d->isActive()) { // create new timer
        QObject::killTimer(d->id);                        // restart timer
        Qt::TimerId newId{ QObject::startTimer(msec * 1ms, d->type) };  // overflow impossible
        if (newId > Qt::TimerId::Invalid) {
            // Restarted successfully. No need to update the active state.
            d->id = newId;
        } else {
            // Failed to start the timer.
            // Need to notify about active state change.
            d->id = Qt::TimerId::Invalid;
            d->isActiveData.notify();
        }
    }
    if (intervalChanged)
        d->inter.notify();
}